

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

work_t __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,long i,long k,int j)

{
  long *plVar1;
  int *piVar2;
  int *in_RDI;
  int local_48 [2];
  long local_40 [3];
  long local_28;
  int local_1c;
  long local_18;
  long local_10 [2];
  
  local_28 = 0;
  plVar1 = std::max<long>(&local_28,local_10);
  local_10[0] = *plVar1;
  local_40[2] = *(long *)(in_RDI + 2) + -1;
  plVar1 = std::min<long>(local_40 + 2,local_10);
  local_10[0] = *plVar1;
  local_40[1] = 0;
  plVar1 = std::max<long>(local_40 + 1,&local_18);
  local_18 = *plVar1;
  local_40[0] = *(long *)(in_RDI + 4) + -1;
  plVar1 = std::min<long>(local_40,&local_18);
  local_18 = *plVar1;
  local_48[1] = 0;
  piVar2 = std::max<int>(local_48 + 1,&local_1c);
  local_1c = *piVar2;
  local_48[0] = *in_RDI + -1;
  piVar2 = std::min<int>(local_48,&local_1c);
  return (work_t)*(byte *)(*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)*piVar2 * 8) +
                                    local_18 * 8) + local_10[0]);
}

Assistant:

work_t getBounds(long i, long k, int j=0) const
    {
      i=std::max(0l, i);
      i=std::min(width-1, i);

      k=std::max(0l, k);
      k=std::min(height-1, k);

      j=std::max(0, j);
      j=std::min(depth-1, j);

      return static_cast<work_t>(img[j][k][i]);
    }